

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdAuto.c
# Opt level: O1

void Cmf_CreateOptions_rec(Vec_Wec_t *vPars,int iPar,char (*Argv) [20],int Argc,Vec_Ptr_t *vOpts)

{
  float fVar1;
  uint uVar2;
  Vec_Int_t *pVVar3;
  uint *puVar4;
  long lVar5;
  satoko_opts_t *psVar6;
  void **ppvVar7;
  char *pcVar8;
  int iVar9;
  ulong uVar10;
  long lVar11;
  char (*__s) [20];
  char *local_358 [101];
  
  uVar10 = (ulong)(uint)iPar << 4 | 4;
  __s = Argv + Argc;
  while( true ) {
    if (100 < Argc) {
      __assert_fail("Argc <= CMD_AUTO_ARG_MAX",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cmd/cmdAuto.c"
                    ,0x1cc,
                    "void Cmf_CreateOptions_rec(Vec_Wec_t *, int, char (*)[20], int, Vec_Ptr_t *)");
    }
    if (iPar == vPars->nSize) break;
    if ((iPar < 0) || (vPars->nSize <= iPar)) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWec.h"
                    ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
    }
    pVVar3 = vPars->pArray;
    if (*(int *)((long)&pVVar3->nCap + uVar10) != 2) {
      if (*(int *)((long)&pVVar3->nCap + uVar10) < 2) {
        return;
      }
      lVar11 = 1;
      do {
        lVar5 = *(long *)((long)&pVVar3->nSize + uVar10);
        fVar1 = *(float *)(lVar5 + lVar11 * 4);
        if (fVar1 < 0.0) {
          __assert_fail("NumF >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cmd/cmdAuto.c"
                        ,0x1f1,
                        "void Cmf_CreateOptions_rec(Vec_Wec_t *, int, char (*)[20], int, Vec_Ptr_t *)"
                       );
        }
        sprintf(*__s,"-%c",(ulong)*(uint *)(lVar5 + -4 + lVar11 * 4));
        if ((fVar1 != (float)(int)fVar1) || (NAN(fVar1) || NAN((float)(int)fVar1))) {
          sprintf(__s[1],"%.3f",SUB84((double)fVar1,0));
        }
        else {
          sprintf(__s[1],"%d",(ulong)(uint)(int)fVar1);
        }
        Cmf_CreateOptions_rec(vPars,iPar + 1,Argv,Argc + 2,vOpts);
        lVar11 = lVar11 + 2;
      } while ((int)lVar11 < *(int *)((long)&pVVar3->nCap + uVar10));
      return;
    }
    puVar4 = *(uint **)((long)&pVVar3->nSize + uVar10);
    fVar1 = (float)puVar4[1];
    if ((fVar1 != -1.0) || (NAN(fVar1))) {
      __assert_fail("Abc_Int2Float(Num) == -1.0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cmd/cmdAuto.c"
                    ,0x1e4,
                    "void Cmf_CreateOptions_rec(Vec_Wec_t *, int, char (*)[20], int, Vec_Ptr_t *)");
    }
    uVar2 = *puVar4;
    iPar = iPar + 1;
    Cmf_CreateOptions_rec(vPars,iPar,Argv,Argc,vOpts);
    sprintf(*__s,"-%c",(ulong)uVar2);
    Argc = Argc + 1;
    uVar10 = uVar10 + 0x10;
    __s = __s + 1;
  }
  if (0 < Argc) {
    uVar10 = 0;
    do {
      local_358[uVar10] = *Argv;
      uVar10 = uVar10 + 1;
      Argv = Argv + 1;
    } while ((uint)Argc != uVar10);
  }
  psVar6 = Cmd_DeriveOptionFromSettings(Argc,local_358);
  if (psVar6 == (satoko_opts_t *)0x0) {
    puts("Cannot parse command line options...");
    return;
  }
  uVar2 = vOpts->nCap;
  if (vOpts->nSize == uVar2) {
    if ((int)uVar2 < 0x10) {
      if (vOpts->pArray == (void **)0x0) {
        ppvVar7 = (void **)malloc(0x80);
      }
      else {
        ppvVar7 = (void **)realloc(vOpts->pArray,0x80);
      }
      vOpts->pArray = ppvVar7;
      iVar9 = 0x10;
    }
    else {
      iVar9 = uVar2 * 2;
      if (iVar9 <= (int)uVar2) goto LAB_00320ddb;
      if (vOpts->pArray == (void **)0x0) {
        ppvVar7 = (void **)malloc((ulong)uVar2 << 4);
      }
      else {
        ppvVar7 = (void **)realloc(vOpts->pArray,(ulong)uVar2 << 4);
      }
      vOpts->pArray = ppvVar7;
    }
    vOpts->nCap = iVar9;
  }
LAB_00320ddb:
  iVar9 = vOpts->nSize;
  vOpts->nSize = iVar9 + 1;
  vOpts->pArray[iVar9] = psVar6;
  pcVar8 = Cmd_DeriveConvertIntoString(Argc,local_358);
  uVar2 = vOpts->nCap;
  if (vOpts->nSize == uVar2) {
    if ((int)uVar2 < 0x10) {
      if (vOpts->pArray == (void **)0x0) {
        ppvVar7 = (void **)malloc(0x80);
      }
      else {
        ppvVar7 = (void **)realloc(vOpts->pArray,0x80);
      }
      iVar9 = 0x10;
    }
    else {
      iVar9 = uVar2 * 2;
      if (iVar9 <= (int)uVar2) goto LAB_00320e54;
      if (vOpts->pArray == (void **)0x0) {
        ppvVar7 = (void **)malloc((ulong)uVar2 << 4);
      }
      else {
        ppvVar7 = (void **)realloc(vOpts->pArray,(ulong)uVar2 << 4);
      }
    }
    vOpts->pArray = ppvVar7;
    vOpts->nCap = iVar9;
  }
LAB_00320e54:
  iVar9 = vOpts->nSize;
  vOpts->nSize = iVar9 + 1U;
  vOpts->pArray[iVar9] = pcVar8;
  if (-1 < (long)iVar9) {
    printf("Adding settings %s\n",vOpts->pArray[(ulong)(iVar9 + 1U) - 1]);
    return;
  }
  __assert_fail("p->nSize > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                ,0x1b7,"void *Vec_PtrEntryLast(Vec_Ptr_t *)");
}

Assistant:

void Cmf_CreateOptions_rec( Vec_Wec_t * vPars, int iPar, char Argv[CMD_AUTO_ARG_MAX][20], int Argc, Vec_Ptr_t * vOpts )
{
    Vec_Int_t * vLine;
    int Symb, Num, i;
    assert( Argc <= CMD_AUTO_ARG_MAX );
    if ( Vec_WecSize(vPars) == iPar )
    {
        satoko_opts_t * pOpts;
        char * pArgv[CMD_AUTO_ARG_MAX];
        for ( i = 0; i < Argc; i++ )
            pArgv[i] = Argv[i];
        pOpts = Cmd_DeriveOptionFromSettings( Argc, pArgv );
        if ( pOpts == NULL )
            printf( "Cannot parse command line options...\n" );
        else
        {
            Vec_PtrPush( vOpts, pOpts );
            Vec_PtrPush( vOpts, Cmd_DeriveConvertIntoString(Argc, pArgv) );
            printf( "Adding settings %s\n", (char *)Vec_PtrEntryLast(vOpts) );
        }
        return;
    }
    vLine = Vec_WecEntry( vPars, iPar );
    // consider binary option
    if ( Vec_IntSize(vLine) == 2 )
    {
        Symb = Vec_IntEntry( vLine, 0 );
        Num = Vec_IntEntry( vLine, 1 );
        assert( Abc_Int2Float(Num) == -1.0 );
        // create one setting without this option
        Cmf_CreateOptions_rec( vPars, iPar+1, Argv, Argc, vOpts );
        // create another setting with this option
        sprintf( Argv[Argc], "-%c", Symb );
        Cmf_CreateOptions_rec( vPars, iPar+1, Argv, Argc+1, vOpts );
        return;
    }
    // consider numeric option
    Vec_IntForEachEntryDouble( vLine, Symb, Num, i )
    {
        float NumF = Abc_Int2Float(Num);
        // create setting with this option
        assert( NumF >= 0 );
        sprintf( Argv[Argc], "-%c", Symb );
        if ( NumF == (float)(int)NumF )
            sprintf( Argv[Argc+1], "%d", (int)NumF );
        else
            sprintf( Argv[Argc+1], "%.3f", NumF );
        Cmf_CreateOptions_rec( vPars, iPar+1, Argv, Argc+2, vOpts );
    }
}